

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BRDFile.cpp
# Opt level: O1

void __thiscall BRDFile::BRDFile(BRDFile *this,vector<char,_std::allocator<char>_> *buf)

{
  string *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer __src;
  iterator __position;
  iterator __position_00;
  char *pcVar2;
  mapped_type pcVar3;
  bool bVar4;
  size_t __size;
  pointer pcVar5;
  value_type vVar6;
  pointer ppcVar7;
  int iVar8;
  uint uVar9;
  int *__dest;
  long lVar10;
  int extraout_var;
  int extraout_var_00;
  int extraout_var_01;
  int extraout_var_02;
  int extraout_var_03;
  int extraout_var_04;
  int extraout_var_05;
  int extraout_var_06;
  int extraout_var_07;
  int extraout_var_08;
  int extraout_var_09;
  value_type vVar11;
  value_type extraout_RAX;
  value_type extraout_RAX_00;
  value_type extraout_RAX_01;
  value_type extraout_RAX_02;
  mapped_type *ppcVar12;
  long *plVar13;
  undefined8 *puVar14;
  value_type *pvVar15;
  size_type *psVar16;
  long *plVar17;
  ulong *puVar18;
  size_t __n;
  pointer ppcVar19;
  byte bVar20;
  undefined8 uVar21;
  BRDNail *nail_1;
  char *pcVar22;
  ulong uVar23;
  int iVar24;
  value_type vVar25;
  BRDNail nail;
  string __str;
  char *p;
  unordered_map<int,_const_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  nailsToNets;
  char *arena_end;
  char *arena;
  char *s;
  vector<char_*,_std::allocator<char_*>_> lines;
  anon_class_32_4_fa413470 local_208;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  long *local_1c8;
  long local_1c0;
  long local_1b8;
  long lStack_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  string *local_108;
  value_type local_100;
  undefined1 local_f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_e0;
  char *pcStack_d0;
  uint uStack_c8;
  int iStack_c4;
  int iStack_c0;
  BRDPoint BStack_bc;
  value_type local_a8;
  pointer local_a0;
  BRDPoint local_98;
  string local_90;
  char *local_70;
  vector<char_*,_std::allocator<char_*>_> local_68;
  vector<BRDPin,std::allocator<BRDPin>> *local_50;
  vector<BRDNail,std::allocator<BRDNail>> *local_48;
  vector<BRDPart,_std::allocator<BRDPart>_> *local_40;
  vector<BRDPoint,_std::allocator<BRDPoint>_> *local_38;
  
  BRDFileBase::BRDFileBase(&this->super_BRDFileBase);
  (this->super_BRDFileBase)._vptr_BRDFileBase = (_func_int **)&PTR__BRDFileBase_0022e330;
  uVar23 = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_a8 = (value_type)this;
  if (4 < uVar23) {
    __size = (uVar23 + 1) * 3;
    __dest = (int *)calloc(1,__size);
    (this->super_BRDFileBase).file_buf = (char *)__dest;
    if (__dest != (int *)0x0) {
      __src = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_start;
      __n = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)__src;
      if (__n != 0) {
        memmove(__dest,__src,__n);
      }
      *(undefined1 *)((long)__dest + uVar23) = 0;
      local_98 = (BRDPoint)(uVar23 + 1 + (long)__dest);
      local_a0 = (pointer)((long)__dest + (__size - 1));
      *(undefined1 *)((long)__dest + (__size - 1)) = 0;
      if (*__dest == 0x2863e223) {
        lVar10 = 0;
        do {
          pcVar22 = (this->super_BRDFileBase).file_buf;
          bVar20 = pcVar22[lVar10];
          if ((0xd < bVar20) || ((0x2401U >> (bVar20 & 0x1f) & 1) == 0)) {
            bVar20 = ~(((byte)((uint)(int)(char)bVar20 >> 6) & 3) + bVar20 * '\x04');
          }
          pcVar22[lVar10] = bVar20;
          lVar10 = lVar10 + 1;
        } while (uVar23 + (uVar23 == 0) != lVar10);
      }
      local_68.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_68.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_68.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      stringfile((this->super_BRDFileBase).file_buf,&local_68);
      ppcVar7 = local_68.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      local_108 = (string *)0x0;
      if (local_68.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_68.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_48 = (vector<BRDNail,std::allocator<BRDNail>> *)&(this->super_BRDFileBase).nails;
        local_108 = (string *)&(this->super_BRDFileBase).error_msg;
        local_50 = (vector<BRDPin,std::allocator<BRDPin>> *)&(this->super_BRDFileBase).pins;
        local_40 = &(this->super_BRDFileBase).parts;
        local_38 = &(this->super_BRDFileBase).format;
        iVar24 = 0;
        ppcVar19 = local_68.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        do {
          vVar25 = (value_type)((long)*ppcVar19 + -1);
          do {
            bVar20 = *(byte *)((long)vVar25 + 1);
            vVar25 = (value_type)((long)vVar25 + 1);
            vVar11.x = isspace((uint)bVar20);
            vVar11.y = extraout_var;
          } while (vVar11.x != 0);
          this = (BRDFile *)local_a8;
          iVar8 = iVar24;
          if (bVar20 != 0) {
            vVar11.x = strcmp((char *)vVar25,"str_length:");
            this = (BRDFile *)local_a8;
            vVar11.y = extraout_var_00;
            if (vVar11.x == 0) {
              iVar8 = 1;
            }
            else {
              vVar11.x = strcmp((char *)vVar25,"var_data:");
              vVar11.y = extraout_var_01;
              if (vVar11.x == 0) {
                iVar8 = 2;
              }
              else {
                vVar11.x = strcmp((char *)vVar25,"Format:");
                vVar11.y = extraout_var_02;
                iVar8 = 3;
                if (vVar11.x != 0) {
                  vVar11.x = strcmp((char *)vVar25,"format:");
                  vVar11.y = extraout_var_03;
                  if (vVar11.x != 0) {
                    vVar11.x = strcmp((char *)vVar25,"Parts:");
                    vVar11.y = extraout_var_04;
                    iVar8 = 4;
                    if (vVar11.x != 0) {
                      vVar11.x = strcmp((char *)vVar25,"Pins1:");
                      vVar11.y = extraout_var_05;
                      if (vVar11.x != 0) {
                        vVar11.x = strcmp((char *)vVar25,"Pins:");
                        vVar11.y = extraout_var_06;
                        iVar8 = 5;
                        if (vVar11.x != 0) {
                          vVar11.x = strcmp((char *)vVar25,"Pins2:");
                          vVar11.y = extraout_var_07;
                          if (vVar11.x != 0) {
                            vVar11.x = strcmp((char *)vVar25,"Nails:");
                            vVar6 = local_a8;
                            vVar11.y = extraout_var_08;
                            if (vVar11.x == 0) {
                              iVar8 = 6;
                            }
                            else {
                              vVar11.y = 0;
                              vVar11.x = iVar24 - 2;
                              iVar8 = iVar24;
                              local_100 = vVar25;
                              switch(vVar11) {
                              case (value_type)0x0:
                                local_a8.x = (int)this;
                                local_a8.y = SUB84(this,4);
                                local_f8._8_4_ = local_a8.x;
                                local_f8._12_4_ = local_a8.y;
                                local_f8._0_8_ = &local_100;
                                local_a8 = vVar6;
                                uVar9 = BRDFile::anon_class_16_2_d7082a65::operator()
                                                  ((anon_class_16_2_d7082a65 *)local_f8);
                                vVar25 = local_a8;
                                *(uint *)((long)this + 8) = uVar9;
                                local_a8.x = (int)this;
                                local_a8.y = SUB84(this,4);
                                local_f8._8_4_ = local_a8.x;
                                local_f8._12_4_ = local_a8.y;
                                local_f8._0_8_ = &local_100;
                                local_a8 = vVar25;
                                uVar9 = BRDFile::anon_class_16_2_d7082a65::operator()
                                                  ((anon_class_16_2_d7082a65 *)local_f8);
                                vVar25 = local_a8;
                                *(uint *)((long)this + 0xc) = uVar9;
                                local_a8.x = (int)this;
                                local_a8.y = SUB84(this,4);
                                local_f8._8_4_ = local_a8.x;
                                local_f8._12_4_ = local_a8.y;
                                local_f8._0_8_ = &local_100;
                                local_a8 = vVar25;
                                uVar9 = BRDFile::anon_class_16_2_d7082a65::operator()
                                                  ((anon_class_16_2_d7082a65 *)local_f8);
                                vVar25 = local_a8;
                                *(uint *)((long)this + 0x10) = uVar9;
                                local_a8.x = (int)this;
                                local_a8.y = SUB84(this,4);
                                local_f8._8_4_ = local_a8.x;
                                local_f8._12_4_ = local_a8.y;
                                local_f8._0_8_ = &local_100;
                                local_a8 = vVar25;
                                vVar11.x = BRDFile::anon_class_16_2_d7082a65::operator()
                                                     ((anon_class_16_2_d7082a65 *)local_f8);
                                vVar11.y = extraout_var_09;
                                *(uint *)((long)this + 0x14) = vVar11.x;
                                break;
                              case (value_type)0x1:
                                if ((ulong)*(uint *)((long)this + 8) <=
                                    (ulong)((long)((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)((long)this + 0x20))->_M_allocated_capacity -
                                            (long)*(char **)((long)this + 0x18) >> 3)) {
                                  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_148,
                                             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
                                             ,"");
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_148)
                                  ;
                                  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                                  psVar16 = (size_type *)(plVar13 + 2);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)*plVar13 ==
                                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)psVar16) {
                                    local_188.field_2._M_allocated_capacity = *psVar16;
                                    local_188.field_2._8_8_ = plVar13[3];
                                  }
                                  else {
                                    local_188.field_2._M_allocated_capacity = *psVar16;
                                    local_188._M_dataplus._M_p = (pointer)*plVar13;
                                  }
                                  local_188._M_string_length = plVar13[1];
                                  *plVar13 = (long)psVar16;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  std::__cxx11::to_string(&local_128,0x61);
                                  std::operator+(&local_168,&local_188,&local_128);
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_168)
                                  ;
                                  local_1e8 = &local_1d8;
                                  plVar17 = plVar13 + 2;
                                  if ((long *)*plVar13 == plVar17) {
                                    local_1d8 = *plVar17;
                                    lStack_1d0 = plVar13[3];
                                  }
                                  else {
                                    local_1d8 = *plVar17;
                                    local_1e8 = (long *)*plVar13;
                                  }
                                  local_1e0 = plVar13[1];
                                  *plVar13 = (long)plVar17;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1e8)
                                  ;
                                  local_1c8 = &local_1b8;
                                  plVar17 = plVar13 + 2;
                                  if ((long *)*plVar13 == plVar17) {
                                    local_1b8 = *plVar17;
                                    lStack_1b0 = plVar13[3];
                                  }
                                  else {
                                    local_1b8 = *plVar17;
                                    local_1c8 = (long *)*plVar13;
                                  }
                                  local_1c0 = plVar13[1];
                                  *plVar13 = (long)plVar17;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1c8)
                                  ;
                                  local_1a8 = &local_198;
                                  plVar17 = plVar13 + 2;
                                  if ((long *)*plVar13 == plVar17) {
                                    local_198 = *plVar17;
                                    lStack_190 = plVar13[3];
                                  }
                                  else {
                                    local_198 = *plVar17;
                                    local_1a8 = (long *)*plVar13;
                                  }
                                  local_1a0 = plVar13[1];
                                  *plVar13 = (long)plVar17;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1a8)
                                  ;
                                  local_208.p = (char **)&local_208.arena;
                                  pvVar15 = (value_type *)(plVar13 + 2);
                                  if ((value_type *)*plVar13 == pvVar15) {
                                    local_208.arena = *(char ***)pvVar15;
                                    local_208.arena_end = (char **)plVar13[3];
                                  }
                                  else {
                                    local_208.arena = *(char ***)pvVar15;
                                    local_208.p = (char **)*plVar13;
                                  }
                                  local_208.s = *(char ***)(plVar13 + 1);
                                  *plVar13 = (long)pvVar15;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  pvVar15 = (value_type *)
                                            std::__cxx11::string::append((char *)&local_208);
                                  vVar25 = (value_type)(pvVar15 + 2);
                                  if (*pvVar15 == vVar25) {
                                    local_f8._16_8_ = *(undefined8 *)vVar25;
                                    aStack_e0._M_allocated_capacity = (size_type)pvVar15[3];
                                    local_f8._0_8_ = (long)local_f8 + 0x10;
                                  }
                                  else {
                                    local_f8._16_8_ = *(undefined8 *)vVar25;
                                    local_f8._0_8_ = *pvVar15;
                                  }
                                  local_f8._8_8_ = pvVar15[1];
                                  *pvVar15 = vVar25;
                                  pvVar15[1].x = 0;
                                  pvVar15[1].y = 0;
                                  *(undefined1 *)&pvVar15[2].x = 0;
                                  std::__cxx11::string::operator=(local_108,(string *)local_f8);
                                  if (local_f8._0_8_ != (long)local_f8 + 0x10) {
                                    operator_delete((void *)local_f8._0_8_,
                                                    (ulong)((long)(_Hash_node_base **)
                                                                  local_f8._16_8_ + 1));
                                  }
                                  if ((char ***)local_208.p != &local_208.arena) {
                                    operator_delete(local_208.p,(ulong)((long)local_208.arena + 1));
                                  }
                                  if (local_1a8 != &local_198) {
                                    operator_delete(local_1a8,local_198 + 1);
                                  }
                                  if (local_1c8 != &local_1b8) {
                                    operator_delete(local_1c8,local_1b8 + 1);
                                  }
                                  if (local_1e8 != &local_1d8) {
                                    operator_delete(local_1e8,local_1d8 + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                    operator_delete(local_168._M_dataplus._M_p,
                                                    local_168.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_128._M_dataplus._M_p != &local_128.field_2) {
                                    operator_delete(local_128._M_dataplus._M_p,
                                                    local_128.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                    operator_delete(local_188._M_dataplus._M_p,
                                                    local_188.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_148._M_dataplus._M_p != &local_148.field_2) {
                                    operator_delete(local_148._M_dataplus._M_p,
                                                    local_148.field_2._M_allocated_capacity + 1);
                                  }
                                  SDL_LogError(1,"%s",*(undefined8 *)local_108);
                                }
                                local_f8._0_4_ = 0;
                                local_f8._4_4_ = 0;
                                lVar10 = strtol((char *)local_100,(char **)&local_100,10);
                                local_f8._0_4_ = (int)lVar10;
                                lVar10 = strtol((char *)local_100,(char **)&local_100,10);
                                local_f8._4_4_ = (int)lVar10;
                                std::vector<BRDPoint,_std::allocator<BRDPoint>_>::push_back
                                          (local_38,(value_type *)local_f8);
                                vVar11 = extraout_RAX_00;
                                break;
                              case (value_type)0x2:
                                if ((ulong)*(uint *)((long)this + 0xc) <=
                                    (ulong)(((long)((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)((long)this + 0x50))->_M_allocated_capacity -
                                             (long)*(char **)((long)this + 0x48) >> 3) *
                                           -0x71c71c71c71c71c7)) {
                                  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_148,
                                             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
                                             ,"");
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_148)
                                  ;
                                  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                                  psVar16 = (size_type *)(plVar13 + 2);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)*plVar13 ==
                                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)psVar16) {
                                    local_188.field_2._M_allocated_capacity = *psVar16;
                                    local_188.field_2._8_8_ = plVar13[3];
                                  }
                                  else {
                                    local_188.field_2._M_allocated_capacity = *psVar16;
                                    local_188._M_dataplus._M_p = (pointer)*plVar13;
                                  }
                                  local_188._M_string_length = plVar13[1];
                                  *plVar13 = (long)psVar16;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  std::__cxx11::to_string(&local_128,0x68);
                                  std::operator+(&local_168,&local_188,&local_128);
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_168)
                                  ;
                                  local_1e8 = &local_1d8;
                                  plVar17 = plVar13 + 2;
                                  if ((long *)*plVar13 == plVar17) {
                                    local_1d8 = *plVar17;
                                    lStack_1d0 = plVar13[3];
                                  }
                                  else {
                                    local_1d8 = *plVar17;
                                    local_1e8 = (long *)*plVar13;
                                  }
                                  local_1e0 = plVar13[1];
                                  *plVar13 = (long)plVar17;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1e8)
                                  ;
                                  local_1c8 = &local_1b8;
                                  plVar17 = plVar13 + 2;
                                  if ((long *)*plVar13 == plVar17) {
                                    local_1b8 = *plVar17;
                                    lStack_1b0 = plVar13[3];
                                  }
                                  else {
                                    local_1b8 = *plVar17;
                                    local_1c8 = (long *)*plVar13;
                                  }
                                  local_1c0 = plVar13[1];
                                  *plVar13 = (long)plVar17;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1c8)
                                  ;
                                  local_1a8 = &local_198;
                                  plVar17 = plVar13 + 2;
                                  if ((long *)*plVar13 == plVar17) {
                                    local_198 = *plVar17;
                                    lStack_190 = plVar13[3];
                                  }
                                  else {
                                    local_198 = *plVar17;
                                    local_1a8 = (long *)*plVar13;
                                  }
                                  local_1a0 = plVar13[1];
                                  *plVar13 = (long)plVar17;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1a8)
                                  ;
                                  local_208.p = (char **)&local_208.arena;
                                  plVar17 = plVar13 + 2;
                                  if ((char ***)*plVar13 == (char ***)plVar17) {
                                    local_208.arena = (char **)*plVar17;
                                    local_208.arena_end = (char **)plVar13[3];
                                  }
                                  else {
                                    local_208.arena = (char **)*plVar17;
                                    local_208.p = (char **)*plVar13;
                                  }
                                  local_208.s = (char **)plVar13[1];
                                  *plVar13 = (long)plVar17;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  pvVar15 = (value_type *)
                                            std::__cxx11::string::append((char *)&local_208);
                                  vVar25 = (value_type)(pvVar15 + 2);
                                  if (*pvVar15 == vVar25) {
                                    local_f8._16_8_ = *(undefined8 *)vVar25;
                                    aStack_e0._M_allocated_capacity = (size_type)pvVar15[3];
                                    local_f8._0_8_ = (long)local_f8 + 0x10;
                                  }
                                  else {
                                    local_f8._16_8_ = *(undefined8 *)vVar25;
                                    local_f8._0_8_ = *pvVar15;
                                  }
                                  local_f8._8_8_ = pvVar15[1];
                                  *pvVar15 = vVar25;
                                  pvVar15[1].x = 0;
                                  pvVar15[1].y = 0;
                                  *(undefined1 *)&pvVar15[2].x = 0;
                                  std::__cxx11::string::operator=(local_108,(string *)local_f8);
                                  if (local_f8._0_8_ != (long)local_f8 + 0x10) {
                                    operator_delete((void *)local_f8._0_8_,
                                                    (ulong)((long)(_Hash_node_base **)
                                                                  local_f8._16_8_ + 1));
                                  }
                                  if ((char ***)local_208.p != &local_208.arena) {
                                    operator_delete(local_208.p,(long)local_208.arena + 1);
                                  }
                                  if (local_1a8 != &local_198) {
                                    operator_delete(local_1a8,local_198 + 1);
                                  }
                                  if (local_1c8 != &local_1b8) {
                                    operator_delete(local_1c8,local_1b8 + 1);
                                  }
                                  if (local_1e8 != &local_1d8) {
                                    operator_delete(local_1e8,local_1d8 + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                    operator_delete(local_168._M_dataplus._M_p,
                                                    local_168.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_128._M_dataplus._M_p != &local_128.field_2) {
                                    operator_delete(local_128._M_dataplus._M_p,
                                                    local_128.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                    operator_delete(local_188._M_dataplus._M_p,
                                                    local_188.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_148._M_dataplus._M_p != &local_148.field_2) {
                                    operator_delete(local_148._M_dataplus._M_p,
                                                    local_148.field_2._M_allocated_capacity + 1);
                                  }
                                  SDL_LogError(1,"%s",*(undefined8 *)local_108);
                                }
                                local_f8._0_4_ = 0;
                                local_f8._4_4_ = 0;
                                local_f8._8_8_ = &aStack_e0;
                                local_f8._16_8_ = (BRDPoint *)0x0;
                                aStack_e0._M_allocated_capacity =
                                     aStack_e0._M_allocated_capacity & 0xffffffffffffff00;
                                iStack_c0 = 0;
                                BStack_bc.x = 0;
                                BStack_bc.y = 0;
                                pcStack_d0 = (char *)0x0;
                                uStack_c8 = 0;
                                iStack_c4 = 0;
                                local_208.s = &local_70;
                                local_208.arena = (char **)&local_98;
                                local_208.arena_end = (char **)&local_a0;
                                local_208.p = (char **)&local_100;
                                local_f8._0_8_ =
                                     BRDFile::anon_class_32_4_fa413470::operator()(&local_208);
                                local_208.s = (char **)this;
                                local_208.p = (char **)&local_100;
                                uVar9 = BRDFile::anon_class_16_2_d7082a65::operator()
                                                  ((anon_class_16_2_d7082a65 *)&local_208);
                                bVar4 = 7 < uVar9 || uVar9 == 2;
                                if (((bVar4) || (uVar9 == 1)) || ((uVar9 & 0xfffffffc) == 4)) {
                                  pcStack_d0._0_4_ = Top - bVar4;
                                }
                                pcStack_d0 = (char *)(ulong)CONCAT14((uVar9 & 0xc) == 0,
                                                                     (BRDPartMountingSide)pcStack_d0
                                                                    );
                                local_208.s = (char **)this;
                                local_208.p = (char **)&local_100;
                                uStack_c8 = BRDFile::anon_class_16_2_d7082a65::operator()
                                                      ((anon_class_16_2_d7082a65 *)&local_208);
                                if (*(uint *)((long)this + 0x10) < uStack_c8) {
                                  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_128,
                                             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
                                             ,"");
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_128)
                                  ;
                                  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                                  psVar16 = (size_type *)(plVar13 + 2);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)*plVar13 ==
                                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)psVar16) {
                                    local_148.field_2._M_allocated_capacity = *psVar16;
                                    local_148.field_2._8_8_ = plVar13[3];
                                  }
                                  else {
                                    local_148.field_2._M_allocated_capacity = *psVar16;
                                    local_148._M_dataplus._M_p = (pointer)*plVar13;
                                  }
                                  local_148._M_string_length = plVar13[1];
                                  *plVar13 = (long)psVar16;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  std::__cxx11::to_string(&local_90,0x70);
                                  std::operator+(&local_188,&local_148,&local_90);
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_188)
                                  ;
                                  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                                  psVar16 = (size_type *)(plVar13 + 2);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)*plVar13 ==
                                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)psVar16) {
                                    local_168.field_2._M_allocated_capacity = *psVar16;
                                    local_168.field_2._8_8_ = plVar13[3];
                                  }
                                  else {
                                    local_168.field_2._M_allocated_capacity = *psVar16;
                                    local_168._M_dataplus._M_p = (pointer)*plVar13;
                                  }
                                  local_168._M_string_length = plVar13[1];
                                  *plVar13 = (long)psVar16;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_168)
                                  ;
                                  local_1e8 = &local_1d8;
                                  plVar17 = plVar13 + 2;
                                  if ((long *)*plVar13 == plVar17) {
                                    local_1d8 = *plVar17;
                                    lStack_1d0 = plVar13[3];
                                  }
                                  else {
                                    local_1d8 = *plVar17;
                                    local_1e8 = (long *)*plVar13;
                                  }
                                  local_1e0 = plVar13[1];
                                  *plVar13 = (long)plVar17;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1e8)
                                  ;
                                  local_1c8 = &local_1b8;
                                  plVar17 = plVar13 + 2;
                                  if ((long *)*plVar13 == plVar17) {
                                    local_1b8 = *plVar17;
                                    lStack_1b0 = plVar13[3];
                                  }
                                  else {
                                    local_1b8 = *plVar17;
                                    local_1c8 = (long *)*plVar13;
                                  }
                                  local_1c0 = plVar13[1];
                                  *plVar13 = (long)plVar17;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1c8)
                                  ;
                                  local_1a8 = &local_198;
                                  plVar17 = plVar13 + 2;
                                  if ((long *)*plVar13 == plVar17) {
                                    local_198 = *plVar17;
                                    lStack_190 = plVar13[3];
                                  }
                                  else {
                                    local_198 = *plVar17;
                                    local_1a8 = (long *)*plVar13;
                                  }
                                  local_1a0 = plVar13[1];
                                  *plVar13 = (long)plVar17;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1a8)
                                  ;
                                  pvVar15 = (value_type *)(plVar13 + 2);
                                  if ((value_type *)*plVar13 == pvVar15) {
                                    local_208.arena = *(char ***)pvVar15;
                                    local_208.arena_end = (char **)plVar13[3];
                                    local_208.p = (char **)&local_208.arena;
                                  }
                                  else {
                                    local_208.arena = *(char ***)pvVar15;
                                    local_208.p = (char **)*plVar13;
                                  }
                                  local_208.s = *(char ***)(plVar13 + 1);
                                  *plVar13 = (long)pvVar15;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  std::__cxx11::string::operator=(local_108,(string *)&local_208);
                                  if ((char ***)local_208.p != &local_208.arena) {
                                    operator_delete(local_208.p,(ulong)((long)local_208.arena + 1));
                                  }
                                  if (local_1a8 != &local_198) {
                                    operator_delete(local_1a8,local_198 + 1);
                                  }
                                  if (local_1c8 != &local_1b8) {
                                    operator_delete(local_1c8,local_1b8 + 1);
                                  }
                                  if (local_1e8 != &local_1d8) {
                                    operator_delete(local_1e8,local_1d8 + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                    operator_delete(local_168._M_dataplus._M_p,
                                                    local_168.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                    operator_delete(local_188._M_dataplus._M_p,
                                                    local_188.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_90._M_dataplus._M_p != &local_90.field_2) {
                                    operator_delete(local_90._M_dataplus._M_p,
                                                    local_90.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_148._M_dataplus._M_p != &local_148.field_2) {
                                    operator_delete(local_148._M_dataplus._M_p,
                                                    local_148.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_128._M_dataplus._M_p != &local_128.field_2) {
                                    operator_delete(local_128._M_dataplus._M_p,
                                                    local_128.field_2._M_allocated_capacity + 1);
                                  }
                                  SDL_LogError(1,"%s",*(undefined8 *)local_108);
                                }
                                std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back
                                          (local_40,(value_type *)local_f8);
                                vVar11 = (value_type)&aStack_e0;
                                if ((value_type)local_f8._8_8_ != vVar11) {
                                  operator_delete((void *)local_f8._8_8_,
                                                  (ulong)(aStack_e0._M_allocated_capacity + 1));
                                  vVar11 = extraout_RAX_02;
                                }
                                break;
                              case (value_type)0x3:
                                if ((ulong)*(uint *)((long)this + 0x10) <=
                                    (ulong)(((long)*(char **)((long)this + 0x68) -
                                             (long)((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)((long)this + 0x60))->_M_allocated_capacity >> 3
                                            ) * 0x6db6db6db6db6db7)) {
                                  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_148,
                                             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
                                             ,"");
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_148)
                                  ;
                                  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                                  psVar16 = (size_type *)(plVar13 + 2);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)*plVar13 ==
                                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)psVar16) {
                                    local_188.field_2._M_allocated_capacity = *psVar16;
                                    local_188.field_2._8_8_ = plVar13[3];
                                  }
                                  else {
                                    local_188.field_2._M_allocated_capacity = *psVar16;
                                    local_188._M_dataplus._M_p = (pointer)*plVar13;
                                  }
                                  local_188._M_string_length = plVar13[1];
                                  *plVar13 = (long)psVar16;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  std::__cxx11::to_string(&local_128,0x74);
                                  std::operator+(&local_168,&local_188,&local_128);
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_168)
                                  ;
                                  local_1e8 = &local_1d8;
                                  plVar17 = plVar13 + 2;
                                  if ((long *)*plVar13 == plVar17) {
                                    local_1d8 = *plVar17;
                                    lStack_1d0 = plVar13[3];
                                  }
                                  else {
                                    local_1d8 = *plVar17;
                                    local_1e8 = (long *)*plVar13;
                                  }
                                  local_1e0 = plVar13[1];
                                  *plVar13 = (long)plVar17;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1e8)
                                  ;
                                  local_1c8 = &local_1b8;
                                  plVar17 = plVar13 + 2;
                                  if ((long *)*plVar13 == plVar17) {
                                    local_1b8 = *plVar17;
                                    lStack_1b0 = plVar13[3];
                                  }
                                  else {
                                    local_1b8 = *plVar17;
                                    local_1c8 = (long *)*plVar13;
                                  }
                                  local_1c0 = plVar13[1];
                                  *plVar13 = (long)plVar17;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1c8)
                                  ;
                                  local_1a8 = &local_198;
                                  plVar17 = plVar13 + 2;
                                  if ((long *)*plVar13 == plVar17) {
                                    local_198 = *plVar17;
                                    lStack_190 = plVar13[3];
                                  }
                                  else {
                                    local_198 = *plVar17;
                                    local_1a8 = (long *)*plVar13;
                                  }
                                  local_1a0 = plVar13[1];
                                  *plVar13 = (long)plVar17;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1a8)
                                  ;
                                  local_208.p = (char **)&local_208.arena;
                                  pvVar15 = (value_type *)(plVar13 + 2);
                                  if ((value_type *)*plVar13 == pvVar15) {
                                    local_208.arena = *(char ***)pvVar15;
                                    local_208.arena_end = (char **)plVar13[3];
                                  }
                                  else {
                                    local_208.arena = *(char ***)pvVar15;
                                    local_208.p = (char **)*plVar13;
                                  }
                                  local_208.s = *(char ***)(plVar13 + 1);
                                  *plVar13 = (long)pvVar15;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  pvVar15 = (value_type *)
                                            std::__cxx11::string::append((char *)&local_208);
                                  vVar25 = (value_type)(pvVar15 + 2);
                                  if (*pvVar15 == vVar25) {
                                    local_f8._16_8_ = *(undefined8 *)vVar25;
                                    aStack_e0._M_allocated_capacity = (size_type)pvVar15[3];
                                    local_f8._0_8_ = (long)local_f8 + 0x10;
                                  }
                                  else {
                                    local_f8._16_8_ = *(undefined8 *)vVar25;
                                    local_f8._0_8_ = *pvVar15;
                                  }
                                  local_f8._8_8_ = pvVar15[1];
                                  *pvVar15 = vVar25;
                                  pvVar15[1].x = 0;
                                  pvVar15[1].y = 0;
                                  *(undefined1 *)&pvVar15[2].x = 0;
                                  std::__cxx11::string::operator=(local_108,(string *)local_f8);
                                  if (local_f8._0_8_ != (long)local_f8 + 0x10) {
                                    operator_delete((void *)local_f8._0_8_,
                                                    (ulong)((long)(_Hash_node_base **)
                                                                  local_f8._16_8_ + 1));
                                  }
                                  if ((char ***)local_208.p != &local_208.arena) {
                                    operator_delete(local_208.p,(ulong)((long)local_208.arena + 1));
                                  }
                                  if (local_1a8 != &local_198) {
                                    operator_delete(local_1a8,local_198 + 1);
                                  }
                                  if (local_1c8 != &local_1b8) {
                                    operator_delete(local_1c8,local_1b8 + 1);
                                  }
                                  if (local_1e8 != &local_1d8) {
                                    operator_delete(local_1e8,local_1d8 + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                    operator_delete(local_168._M_dataplus._M_p,
                                                    local_168.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_128._M_dataplus._M_p != &local_128.field_2) {
                                    operator_delete(local_128._M_dataplus._M_p,
                                                    local_128.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                    operator_delete(local_188._M_dataplus._M_p,
                                                    local_188.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_148._M_dataplus._M_p != &local_148.field_2) {
                                    operator_delete(local_148._M_dataplus._M_p,
                                                    local_148.field_2._M_allocated_capacity + 1);
                                  }
                                  SDL_LogError(1,"%s",*(undefined8 *)local_108);
                                }
                                local_f8._0_4_ = 0;
                                local_f8._4_4_ = 0;
                                local_f8._8_8_ = (BRDFile *)0x0;
                                local_f8._16_8_ = local_f8._16_8_ & 0xffffffff00000000;
                                aStack_e0._M_allocated_capacity = 0x1ed23f;
                                aStack_e0._8_8_ = 0.5;
                                pcStack_d0 = (char *)0x0;
                                uStack_c8 = 0;
                                iStack_c4 = 0;
                                lVar10 = strtol((char *)local_100,(char **)&local_100,10);
                                local_f8._0_4_ = (int)lVar10;
                                lVar10 = strtol((char *)local_100,(char **)&local_100,10);
                                local_f8._4_4_ = (int)lVar10;
                                lVar10 = strtol((char *)local_100,(char **)&local_100,10);
                                local_f8._8_4_ = (int)lVar10;
                                local_208.s = (char **)this;
                                local_208.p = (char **)&local_100;
                                uVar9 = BRDFile::anon_class_16_2_d7082a65::operator()
                                                  ((anon_class_16_2_d7082a65 *)&local_208);
                                local_f8._12_4_ = uVar9;
                                if (*(uint *)((long)this + 0xc) < uVar9) {
                                  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_128,
                                             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
                                             ,"");
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_128)
                                  ;
                                  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                                  psVar16 = (size_type *)(plVar13 + 2);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)*plVar13 ==
                                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)psVar16) {
                                    local_148.field_2._M_allocated_capacity = *psVar16;
                                    local_148.field_2._8_8_ = plVar13[3];
                                  }
                                  else {
                                    local_148.field_2._M_allocated_capacity = *psVar16;
                                    local_148._M_dataplus._M_p = (pointer)*plVar13;
                                  }
                                  local_148._M_string_length = plVar13[1];
                                  *plVar13 = (long)psVar16;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  std::__cxx11::to_string(&local_90,0x7a);
                                  std::operator+(&local_188,&local_148,&local_90);
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_188)
                                  ;
                                  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                                  psVar16 = (size_type *)(plVar13 + 2);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)*plVar13 ==
                                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)psVar16) {
                                    local_168.field_2._M_allocated_capacity = *psVar16;
                                    local_168.field_2._8_8_ = plVar13[3];
                                  }
                                  else {
                                    local_168.field_2._M_allocated_capacity = *psVar16;
                                    local_168._M_dataplus._M_p = (pointer)*plVar13;
                                  }
                                  local_168._M_string_length = plVar13[1];
                                  *plVar13 = (long)psVar16;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_168)
                                  ;
                                  local_1e8 = &local_1d8;
                                  plVar17 = plVar13 + 2;
                                  if ((long *)*plVar13 == plVar17) {
                                    local_1d8 = *plVar17;
                                    lStack_1d0 = plVar13[3];
                                  }
                                  else {
                                    local_1d8 = *plVar17;
                                    local_1e8 = (long *)*plVar13;
                                  }
                                  local_1e0 = plVar13[1];
                                  *plVar13 = (long)plVar17;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1e8)
                                  ;
                                  local_1c8 = &local_1b8;
                                  plVar17 = plVar13 + 2;
                                  if ((long *)*plVar13 == plVar17) {
                                    local_1b8 = *plVar17;
                                    lStack_1b0 = plVar13[3];
                                  }
                                  else {
                                    local_1b8 = *plVar17;
                                    local_1c8 = (long *)*plVar13;
                                  }
                                  local_1c0 = plVar13[1];
                                  *plVar13 = (long)plVar17;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1c8)
                                  ;
                                  local_1a8 = &local_198;
                                  plVar17 = plVar13 + 2;
                                  if ((long *)*plVar13 == plVar17) {
                                    local_198 = *plVar17;
                                    lStack_190 = plVar13[3];
                                  }
                                  else {
                                    local_198 = *plVar17;
                                    local_1a8 = (long *)*plVar13;
                                  }
                                  local_1a0 = plVar13[1];
                                  *plVar13 = (long)plVar17;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1a8)
                                  ;
                                  plVar17 = plVar13 + 2;
                                  if ((char ***)*plVar13 == (char ***)plVar17) {
                                    local_208.arena = (char **)*plVar17;
                                    local_208.arena_end = (char **)plVar13[3];
                                    local_208.p = (char **)&local_208.arena;
                                  }
                                  else {
                                    local_208.arena = (char **)*plVar17;
                                    local_208.p = (char **)*plVar13;
                                  }
                                  local_208.s = (char **)plVar13[1];
                                  *plVar13 = (long)plVar17;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  std::__cxx11::string::operator=(local_108,(string *)&local_208);
                                  if ((char ***)local_208.p != &local_208.arena) {
                                    operator_delete(local_208.p,(long)local_208.arena + 1);
                                  }
                                  if (local_1a8 != &local_198) {
                                    operator_delete(local_1a8,local_198 + 1);
                                  }
                                  if (local_1c8 != &local_1b8) {
                                    operator_delete(local_1c8,local_1b8 + 1);
                                  }
                                  if (local_1e8 != &local_1d8) {
                                    operator_delete(local_1e8,local_1d8 + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                    operator_delete(local_168._M_dataplus._M_p,
                                                    local_168.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                    operator_delete(local_188._M_dataplus._M_p,
                                                    local_188.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_90._M_dataplus._M_p != &local_90.field_2) {
                                    operator_delete(local_90._M_dataplus._M_p,
                                                    local_90.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_148._M_dataplus._M_p != &local_148.field_2) {
                                    operator_delete(local_148._M_dataplus._M_p,
                                                    local_148.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_128._M_dataplus._M_p != &local_128.field_2) {
                                    operator_delete(local_128._M_dataplus._M_p,
                                                    local_128.field_2._M_allocated_capacity + 1);
                                  }
                                  SDL_LogError(1,"%s",*(undefined8 *)local_108);
                                }
                                local_208.p = (char **)&local_100;
                                local_208.s = &local_70;
                                local_208.arena = (char **)&local_98;
                                local_208.arena_end = (char **)&local_a0;
                                aStack_e0._M_allocated_capacity =
                                     (size_type)
                                     BRDFile::anon_class_32_4_fa413470::operator()(&local_208);
                                __position_00._M_current = *(BRDPin **)((long)this + 0x68);
                                if (__position_00._M_current ==
                                    (BRDPin *)
                                    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                      *)((long)this + 0x70))->_M_allocated_capacity) {
                                  std::vector<BRDPin,std::allocator<BRDPin>>::
                                  _M_realloc_insert<BRDPin_const&>
                                            (local_50,__position_00,(BRDPin *)local_f8);
                                  vVar11 = extraout_RAX_01;
                                }
                                else {
                                  vVar11.y = iStack_c4;
                                  vVar11.x = uStack_c8;
                                  (__position_00._M_current)->name = (char *)vVar11;
                                  (__position_00._M_current)->radius = (double)aStack_e0._8_8_;
                                  (__position_00._M_current)->snum = pcStack_d0;
                                  *(undefined8 *)&(__position_00._M_current)->side = local_f8._16_8_
                                  ;
                                  (__position_00._M_current)->net =
                                       (char *)aStack_e0._M_allocated_capacity;
                                  ((__position_00._M_current)->pos).x = local_f8._0_4_;
                                  ((__position_00._M_current)->pos).y = local_f8._4_4_;
                                  (__position_00._M_current)->probe = local_f8._8_4_;
                                  (__position_00._M_current)->part = local_f8._12_4_;
                                  *(char **)((long)this + 0x68) =
                                       *(char **)((long)this + 0x68) + 0x38;
                                }
                                break;
                              case (value_type)0x4:
                                if ((ulong)*(uint *)((long)this + 0x14) <=
                                    (ulong)(((long)((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)((long)this + 0x80))->_M_allocated_capacity -
                                             (long)*(char **)((long)this + 0x78) >> 3) *
                                           -0x5555555555555555)) {
                                  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_148,
                                             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
                                             ,"");
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_148)
                                  ;
                                  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                                  psVar16 = (size_type *)(plVar13 + 2);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)*plVar13 ==
                                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)psVar16) {
                                    local_188.field_2._M_allocated_capacity = *psVar16;
                                    local_188.field_2._8_8_ = plVar13[3];
                                  }
                                  else {
                                    local_188.field_2._M_allocated_capacity = *psVar16;
                                    local_188._M_dataplus._M_p = (pointer)*plVar13;
                                  }
                                  local_188._M_string_length = plVar13[1];
                                  *plVar13 = (long)psVar16;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  std::__cxx11::to_string(&local_128,0x7f);
                                  std::operator+(&local_168,&local_188,&local_128);
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_168)
                                  ;
                                  local_1e8 = &local_1d8;
                                  plVar17 = plVar13 + 2;
                                  if ((long *)*plVar13 == plVar17) {
                                    local_1d8 = *plVar17;
                                    lStack_1d0 = plVar13[3];
                                  }
                                  else {
                                    local_1d8 = *plVar17;
                                    local_1e8 = (long *)*plVar13;
                                  }
                                  local_1e0 = plVar13[1];
                                  *plVar13 = (long)plVar17;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1e8)
                                  ;
                                  local_1c8 = &local_1b8;
                                  plVar17 = plVar13 + 2;
                                  if ((long *)*plVar13 == plVar17) {
                                    local_1b8 = *plVar17;
                                    lStack_1b0 = plVar13[3];
                                  }
                                  else {
                                    local_1b8 = *plVar17;
                                    local_1c8 = (long *)*plVar13;
                                  }
                                  local_1c0 = plVar13[1];
                                  *plVar13 = (long)plVar17;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1c8)
                                  ;
                                  local_1a8 = &local_198;
                                  plVar17 = plVar13 + 2;
                                  if ((long *)*plVar13 == plVar17) {
                                    local_198 = *plVar17;
                                    lStack_190 = plVar13[3];
                                  }
                                  else {
                                    local_198 = *plVar17;
                                    local_1a8 = (long *)*plVar13;
                                  }
                                  local_1a0 = plVar13[1];
                                  *plVar13 = (long)plVar17;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1a8)
                                  ;
                                  local_208.p = (char **)&local_208.arena;
                                  plVar17 = plVar13 + 2;
                                  if ((char ***)*plVar13 == (char ***)plVar17) {
                                    local_208.arena = (char **)*plVar17;
                                    local_208.arena_end = (char **)plVar13[3];
                                  }
                                  else {
                                    local_208.arena = (char **)*plVar17;
                                    local_208.p = (char **)*plVar13;
                                  }
                                  local_208.s = (char **)plVar13[1];
                                  *plVar13 = (long)plVar17;
                                  plVar13[1] = 0;
                                  *(undefined1 *)(plVar13 + 2) = 0;
                                  pvVar15 = (value_type *)
                                            std::__cxx11::string::append((char *)&local_208);
                                  vVar25 = (value_type)(pvVar15 + 2);
                                  if (*pvVar15 == vVar25) {
                                    local_f8._16_8_ = *(undefined8 *)vVar25;
                                    aStack_e0._M_allocated_capacity = (size_type)pvVar15[3];
                                    local_f8._0_8_ = (long)local_f8 + 0x10;
                                  }
                                  else {
                                    local_f8._16_8_ = *(undefined8 *)vVar25;
                                    local_f8._0_8_ = *pvVar15;
                                  }
                                  local_f8._8_8_ = pvVar15[1];
                                  *pvVar15 = vVar25;
                                  pvVar15[1].x = 0;
                                  pvVar15[1].y = 0;
                                  *(undefined1 *)&pvVar15[2].x = 0;
                                  std::__cxx11::string::operator=(local_108,(string *)local_f8);
                                  if (local_f8._0_8_ != (long)local_f8 + 0x10) {
                                    operator_delete((void *)local_f8._0_8_,
                                                    (ulong)((long)(_Hash_node_base **)
                                                                  local_f8._16_8_ + 1));
                                  }
                                  if ((char ***)local_208.p != &local_208.arena) {
                                    operator_delete(local_208.p,(long)local_208.arena + 1);
                                  }
                                  if (local_1a8 != &local_198) {
                                    operator_delete(local_1a8,local_198 + 1);
                                  }
                                  if (local_1c8 != &local_1b8) {
                                    operator_delete(local_1c8,local_1b8 + 1);
                                  }
                                  if (local_1e8 != &local_1d8) {
                                    operator_delete(local_1e8,local_1d8 + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                    operator_delete(local_168._M_dataplus._M_p,
                                                    local_168.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_128._M_dataplus._M_p != &local_128.field_2) {
                                    operator_delete(local_128._M_dataplus._M_p,
                                                    local_128.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                    operator_delete(local_188._M_dataplus._M_p,
                                                    local_188.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_148._M_dataplus._M_p != &local_148.field_2) {
                                    operator_delete(local_148._M_dataplus._M_p,
                                                    local_148.field_2._M_allocated_capacity + 1);
                                  }
                                  SDL_LogError(1,"%s",*(undefined8 *)local_108);
                                }
                                vVar25 = local_a8;
                                local_208.p = (char **)0x0;
                                local_208.s = (char **)0x0;
                                local_208.arena = (char **)0x1ed23f;
                                local_a8.x = (int)this;
                                local_a8.y = SUB84(this,4);
                                local_f8._8_4_ = local_a8.x;
                                local_f8._12_4_ = local_a8.y;
                                local_f8._0_8_ = &local_100;
                                local_a8 = vVar25;
                                uVar9 = BRDFile::anon_class_16_2_d7082a65::operator()
                                                  ((anon_class_16_2_d7082a65 *)local_f8);
                                local_208.p = (char **)CONCAT44(local_208.p._4_4_,uVar9);
                                lVar10 = strtol((char *)local_100,(char **)&local_100,10);
                                local_208.p = (char **)CONCAT44((int)lVar10,local_208.p._0_4_);
                                lVar10 = strtol((char *)local_100,(char **)&local_100,10);
                                vVar25 = local_a8;
                                local_208.s = (char **)CONCAT44(local_208.s._4_4_,(int)lVar10);
                                local_a8.x = (int)this;
                                local_a8.y = SUB84(this,4);
                                local_f8._8_4_ = local_a8.x;
                                local_f8._12_4_ = local_a8.y;
                                local_f8._0_8_ = &local_100;
                                local_a8 = vVar25;
                                uVar9 = BRDFile::anon_class_16_2_d7082a65::operator()
                                                  ((anon_class_16_2_d7082a65 *)local_f8);
                                local_208.s = (char **)CONCAT44((uVar9 == 1) + 1,(int)local_208.s);
                                local_f8._8_8_ = &local_70;
                                local_f8._16_8_ = &local_98;
                                aStack_e0._M_allocated_capacity = (size_type)&local_a0;
                                local_f8._0_8_ = &local_100;
                                vVar11 = (value_type)
                                         BRDFile::anon_class_32_4_fa413470::operator()
                                                   ((anon_class_32_4_fa413470 *)local_f8);
                                __position._M_current = *(BRDNail **)((long)this + 0x80);
                                local_208.arena = (char **)vVar11;
                                if (__position._M_current == *(BRDNail **)((long)this + 0x88)) {
                                  std::vector<BRDNail,std::allocator<BRDNail>>::
                                  _M_realloc_insert<BRDNail_const&>
                                            (local_48,__position,(BRDNail *)&local_208);
                                  vVar11 = extraout_RAX;
                                }
                                else {
                                  (__position._M_current)->net = (char *)vVar11;
                                  *(char ***)__position._M_current = local_208.p;
                                  *(char ***)&((__position._M_current)->pos).y = local_208.s;
                                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                    *)((long)this + 0x80))->_M_allocated_capacity =
                                       (size_type)
                                       ((char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)((long)this + 0x80))->_M_allocated_capacity +
                                       0x18);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          iVar24 = iVar8;
          ppcVar19 = ppcVar19 + 1;
        } while (ppcVar19 != ppcVar7);
        local_108 = (string *)CONCAT71(vVar11._1_7_,iVar24 != 0);
      }
      local_f8._0_8_ = &uStack_c8;
      local_f8._8_8_ = (BRDFile *)0x1;
      local_f8._16_8_ = (_Hash_node_base *)0x0;
      aStack_e0._M_allocated_capacity = 0;
      aStack_e0._8_4_ = 0x3f800000;
      pcStack_d0 = (char *)0x0;
      uStack_c8 = 0;
      iStack_c4 = 0;
      pcVar22 = *(char **)((long)this + 0x78);
      pcVar2 = (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)this + 0x80))->_M_allocated_capacity;
      if (pcVar22 != pcVar2) {
        do {
          pcVar3 = *(mapped_type *)(pcVar22 + 0x10);
          local_208.p = (char **)CONCAT44(local_208.p._4_4_,*(undefined4 *)pcVar22);
          ppcVar12 = std::__detail::
                     _Map_base<int,_std::pair<const_int,_const_char_*>,_std::allocator<std::pair<const_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<int,_std::pair<const_int,_const_char_*>,_std::allocator<std::pair<const_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_f8,(key_type *)&local_208);
          *ppcVar12 = pcVar3;
          pcVar22 = pcVar22 + 0x18;
        } while (pcVar22 != pcVar2);
      }
      vVar25 = local_a8;
      pcVar22 = (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)((long)local_a8 + 0x60))->_M_allocated_capacity;
      pcVar2 = *(char **)((long)local_a8 + 0x68);
      if (pcVar22 != pcVar2) {
        do {
          if (**(char **)(pcVar22 + 0x18) == '\0') {
            ppcVar12 = std::__detail::
                       _Map_base<int,_std::pair<const_int,_const_char_*>,_std::allocator<std::pair<const_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::at((_Map_base<int,_std::pair<const_int,_const_char_*>,_std::allocator<std::pair<const_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)local_f8,(key_type *)(pcVar22 + 8));
            *(mapped_type *)(pcVar22 + 0x18) = *ppcVar12;
          }
          uVar9 = *(uint *)(*(char **)((long)vVar25 + 0x48) +
                           (ulong)(*(int *)(pcVar22 + 0xc) - 1) * 0x48 + 0x28);
          if (uVar9 < 3) {
            *(uint *)(pcVar22 + 0x10) = uVar9;
          }
          pcVar22 = pcVar22 + 0x38;
        } while (pcVar22 != pcVar2);
      }
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)((long)vVar25 + 0x90))->_M_local_buf[0] = (char)local_108;
      std::
      _Hashtable<int,_std::pair<const_int,_const_char_*>,_std::allocator<std::pair<const_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_const_char_*>,_std::allocator<std::pair<const_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_f8);
      if (local_68.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        return;
      }
      operator_delete(local_68.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
      return;
    }
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
               ,"");
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_148);
    paVar1 = &local_188.field_2;
    puVar18 = (ulong *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar18) {
      local_188.field_2._M_allocated_capacity = *puVar18;
      local_188.field_2._8_8_ = plVar13[3];
      local_188._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_188.field_2._M_allocated_capacity = *puVar18;
      local_188._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_188._M_string_length = plVar13[1];
    *plVar13 = (long)puVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_128,'\x02');
    pcVar5 = local_128._M_dataplus._M_p;
    pcVar5[0] = '3';
    pcVar5[1] = '1';
    uVar21 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != paVar1) {
      uVar21 = local_188.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar21 < local_128._M_string_length + local_188._M_string_length) {
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        uVar21 = local_128.field_2._M_allocated_capacity;
      }
      if (local_128._M_string_length + local_188._M_string_length <= (ulong)uVar21) {
        puVar14 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_128,0,(char *)0x0,(ulong)local_188._M_dataplus._M_p);
        goto LAB_0013ab41;
      }
    }
    puVar14 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_128._M_dataplus._M_p);
LAB_0013ab41:
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    psVar16 = puVar14 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_168.field_2._M_allocated_capacity = *psVar16;
      local_168.field_2._8_8_ = puVar14[3];
    }
    else {
      local_168.field_2._M_allocated_capacity = *psVar16;
      local_168._M_dataplus._M_p = (pointer)*puVar14;
    }
    local_168._M_string_length = puVar14[1];
    *puVar14 = psVar16;
    puVar14[1] = 0;
    *(undefined1 *)psVar16 = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_168);
    local_1e8 = &local_1d8;
    plVar17 = plVar13 + 2;
    if ((long *)*plVar13 == plVar17) {
      local_1d8 = *plVar17;
      lStack_1d0 = plVar13[3];
    }
    else {
      local_1d8 = *plVar17;
      local_1e8 = (long *)*plVar13;
    }
    local_1e0 = plVar13[1];
    *plVar13 = (long)plVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    local_1c8 = &local_1b8;
    plVar17 = plVar13 + 2;
    if ((long *)*plVar13 == plVar17) {
      local_1b8 = *plVar17;
      lStack_1b0 = plVar13[3];
    }
    else {
      local_1b8 = *plVar17;
      local_1c8 = (long *)*plVar13;
    }
    local_1c0 = plVar13[1];
    *plVar13 = (long)plVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    plVar17 = plVar13 + 2;
    if ((long *)*plVar13 == plVar17) {
      local_198 = *plVar17;
      lStack_190 = plVar13[3];
      local_1a8 = &local_198;
    }
    else {
      local_198 = *plVar17;
      local_1a8 = (long *)*plVar13;
    }
    local_1a0 = plVar13[1];
    *plVar13 = (long)plVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    plVar17 = plVar13 + 2;
    if ((char ***)*plVar13 == (char ***)plVar17) {
      local_208.arena = (char **)*plVar17;
      local_208.arena_end = (char **)plVar13[3];
      local_208.p = (char **)&local_208.arena;
    }
    else {
      local_208.arena = (char **)*plVar17;
      local_208.p = (char **)*plVar13;
    }
    local_208.s = (char **)plVar13[1];
    *plVar13 = (long)plVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    pvVar15 = (value_type *)std::__cxx11::string::append((char *)&local_208);
    vVar25 = (value_type)(pvVar15 + 2);
    if (*pvVar15 == vVar25) {
      local_f8._16_8_ = *(undefined8 *)vVar25;
      aStack_e0._M_allocated_capacity = (size_type)pvVar15[3];
      local_f8._0_8_ = (long)local_f8 + 0x10;
    }
    else {
      local_f8._16_8_ = *(undefined8 *)vVar25;
      local_f8._0_8_ = *pvVar15;
    }
    local_f8._8_8_ = pvVar15[1];
    *pvVar15 = vVar25;
    pvVar15[1].x = 0;
    pvVar15[1].y = 0;
    *(undefined1 *)&pvVar15[2].x = 0;
    this_00 = (string *)((long)local_a8 + 0x98);
    std::__cxx11::string::operator=(this_00,(string *)local_f8);
    if (local_f8._0_8_ != (long)local_f8 + 0x10) {
      operator_delete((void *)local_f8._0_8_,(ulong)((long)(_Hash_node_base **)local_f8._16_8_ + 1))
      ;
    }
    if ((char ***)local_208.p != &local_208.arena) {
      operator_delete(local_208.p,(long)local_208.arena + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != paVar1) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    SDL_LogError(1,"%s",*(undefined8 *)this_00);
    return;
  }
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_148,
             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
             ,"");
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_148);
  paVar1 = &local_188.field_2;
  puVar18 = (ulong *)(plVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar18) {
    local_188.field_2._M_allocated_capacity = *puVar18;
    local_188.field_2._8_8_ = plVar13[3];
    local_188._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_188.field_2._M_allocated_capacity = *puVar18;
    local_188._M_dataplus._M_p = (pointer)*plVar13;
  }
  local_188._M_string_length = plVar13[1];
  *plVar13 = (long)puVar18;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_128,'\x02');
  pcVar5 = local_128._M_dataplus._M_p;
  pcVar5[0] = '2';
  pcVar5[1] = '8';
  uVar21 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar1) {
    uVar21 = local_188.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar21 < local_128._M_string_length + local_188._M_string_length) {
    uVar21 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      uVar21 = local_128.field_2._M_allocated_capacity;
    }
    if (local_128._M_string_length + local_188._M_string_length <= (ulong)uVar21) {
      puVar14 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_128,0,(char *)0x0,(ulong)local_188._M_dataplus._M_p);
      goto LAB_0013a71b;
    }
  }
  puVar14 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_128._M_dataplus._M_p);
LAB_0013a71b:
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  psVar16 = puVar14 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar16) {
    local_168.field_2._M_allocated_capacity = *psVar16;
    local_168.field_2._8_8_ = puVar14[3];
  }
  else {
    local_168.field_2._M_allocated_capacity = *psVar16;
    local_168._M_dataplus._M_p = (pointer)*puVar14;
  }
  local_168._M_string_length = puVar14[1];
  *puVar14 = psVar16;
  puVar14[1] = 0;
  *(undefined1 *)psVar16 = 0;
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_168);
  local_1e8 = &local_1d8;
  plVar17 = plVar13 + 2;
  if ((long *)*plVar13 == plVar17) {
    local_1d8 = *plVar17;
    lStack_1d0 = plVar13[3];
  }
  else {
    local_1d8 = *plVar17;
    local_1e8 = (long *)*plVar13;
  }
  local_1e0 = plVar13[1];
  *plVar13 = (long)plVar17;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  plVar17 = plVar13 + 2;
  if ((long *)*plVar13 == plVar17) {
    local_1b8 = *plVar17;
    lStack_1b0 = plVar13[3];
    local_1c8 = &local_1b8;
  }
  else {
    local_1b8 = *plVar17;
    local_1c8 = (long *)*plVar13;
  }
  local_1c0 = plVar13[1];
  *plVar13 = (long)plVar17;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  local_1a8 = &local_198;
  plVar17 = plVar13 + 2;
  if ((long *)*plVar13 == plVar17) {
    local_198 = *plVar17;
    lStack_190 = plVar13[3];
  }
  else {
    local_198 = *plVar17;
    local_1a8 = (long *)*plVar13;
  }
  local_1a0 = plVar13[1];
  *plVar13 = (long)plVar17;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1a8);
  plVar17 = plVar13 + 2;
  if ((char ***)*plVar13 == (char ***)plVar17) {
    local_208.arena = (char **)*plVar17;
    local_208.arena_end = (char **)plVar13[3];
    local_208.p = (char **)&local_208.arena;
  }
  else {
    local_208.arena = (char **)*plVar17;
    local_208.p = (char **)*plVar13;
  }
  local_208.s = (char **)plVar13[1];
  *plVar13 = (long)plVar17;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  pvVar15 = (value_type *)std::__cxx11::string::append((char *)&local_208);
  vVar25 = (value_type)(pvVar15 + 2);
  if (*pvVar15 == vVar25) {
    local_f8._16_8_ = *(undefined8 *)vVar25;
    aStack_e0._M_allocated_capacity = (size_type)pvVar15[3];
    local_f8._0_8_ = (long)local_f8 + 0x10;
  }
  else {
    local_f8._16_8_ = *(undefined8 *)vVar25;
    local_f8._0_8_ = *pvVar15;
  }
  local_f8._8_8_ = pvVar15[1];
  *pvVar15 = vVar25;
  pvVar15[1].x = 0;
  pvVar15[1].y = 0;
  *(undefined1 *)&pvVar15[2].x = 0;
  local_108 = (string *)&((BRDFileBase *)local_a8)->error_msg;
  std::__cxx11::string::operator=(local_108,(string *)local_f8);
  if (local_f8._0_8_ != (long)local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_,(ulong)((long)(_Hash_node_base **)local_f8._16_8_ + 1));
  }
  if ((char ***)local_208.p != &local_208.arena) {
    operator_delete(local_208.p,(long)local_208.arena + 1);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,local_198 + 1);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,local_1b8 + 1);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,local_1d8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar1) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  SDL_LogError(1,"%s",((_Alloc_hider *)&local_108->field_0x0)->_M_p);
  return;
}

Assistant:

BRDFile::BRDFile(std::vector<char> &buf) {
	auto buffer_size = buf.size();
	ENSURE_OR_FAIL(buffer_size > 4, error_msg, return);
	size_t file_buf_size = 3 * (1 + buffer_size);
	file_buf             = (char *)calloc(1, file_buf_size);
	ENSURE_OR_FAIL(file_buf != nullptr, error_msg, return);

	std::copy(buf.begin(), buf.end(), file_buf);
	file_buf[buffer_size] = 0;
	// This is for fixing degenerate utf8
	char *arena     = &file_buf[buffer_size + 1];
	char *arena_end = file_buf + file_buf_size - 1;
	*arena_end      = 0;

	// decode the file if it appears to be encoded:
	static const uint8_t encoded_header[] = {0x23, 0xe2, 0x63, 0x28};
	if (!memcmp(file_buf, encoded_header, 4)) {
		for (size_t i = 0; i < buffer_size; i++) {
			char x = file_buf[i];
			if (!(x == '\r' || x == '\n' || !x)) {
				int c = x;
				x     = ~(((c >> 6) & 3) | (c << 2));
			}
			file_buf[i] = x;
		}
	}

	int current_block = 0;
	std::vector<char*> lines;
	stringfile(file_buf, lines);

	for (char *line : lines) {
		while (isspace((uint8_t)*line)) line++;
		if (!line[0]) continue;
		if (!strcmp(line, "str_length:")) {
			current_block = 1;
			continue;
		}
		if (!strcmp(line, "var_data:")) {
			current_block = 2;
			continue;
		}
		if (!strcmp(line, "Format:") || !strcmp(line, "format:")) {
			current_block = 3;
			continue;
		}
		if (!strcmp(line, "Parts:") || !strcmp(line, "Pins1:")) {
			current_block = 4;
			continue;
		}
		if (!strcmp(line, "Pins:") || !strcmp(line, "Pins2:")) {
			current_block = 5;
			continue;
		}
		if (!strcmp(line, "Nails:")) {
			current_block = 6;
			continue;
		}

		char *p = line;
		char *s;
		unsigned int tmp = 0;

		switch (current_block) {
			case 2: { // var_data
				num_format = READ_UINT();
				num_parts  = READ_UINT();
				num_pins   = READ_UINT();
				num_nails  = READ_UINT();
			} break;
			case 3: { // Format
				ENSURE(format.size() < num_format, error_msg);
				BRDPoint fmt;
				fmt.x = strtol(p, &p, 10);
				fmt.y = strtol(p, &p, 10);
				format.push_back(fmt);
			} break;
			case 4: { // Parts
				ENSURE(parts.size() < num_parts, error_msg);
				BRDPart part;
				part.name      = READ_STR();
				tmp            = READ_UINT(); // Type and layer, actually.
				part.part_type = (tmp & 0xc) ? BRDPartType::SMD : BRDPartType::ThroughHole;
				if (tmp == 1 || (4 <= tmp && tmp < 8)) part.mounting_side = BRDPartMountingSide::Top;
				if (tmp == 2 || (8 <= tmp)) part.mounting_side            = BRDPartMountingSide::Bottom;
				part.end_of_pins                                          = READ_UINT();
				ENSURE(part.end_of_pins <= num_pins, error_msg);
				parts.push_back(part);
			} break;
			case 5: { // Pins
				ENSURE(pins.size() < num_pins, error_msg);
				BRDPin pin;
				pin.pos.x = READ_INT();
				pin.pos.y = READ_INT();
				pin.probe = READ_INT(); // Can be negative (-99)
				pin.part  = READ_UINT();
				ENSURE(pin.part <= num_parts, error_msg);
				pin.net = READ_STR();
				pins.push_back(pin);
			} break;
			case 6: { // Nails
				ENSURE(nails.size() < num_nails, error_msg);
				BRDNail nail;
				nail.probe = READ_UINT();
				nail.pos.x = READ_INT();
				nail.pos.y = READ_INT();
				nail.side  = READ_UINT() == 1 ? BRDPartMountingSide::Top : BRDPartMountingSide::Bottom;
				nail.net   = READ_STR();
				nails.push_back(nail);
			} break;
		}
	}

	// Lenovo brd variant, find net from nail
	std::unordered_map<int, const char *> nailsToNets; // Map between net id and net name
	for (auto &nail : nails) {
		nailsToNets[nail.probe] = nail.net;
	}

	for (auto &pin : pins) {
		if (!strcmp(pin.net, "")) {
			try {
				pin.net = nailsToNets.at(pin.probe);
			} catch (const std::out_of_range &e) {
				pin.net = "";
			}
		}
		switch (parts[pin.part - 1].mounting_side) {
			case BRDPartMountingSide::Top:    pin.side = BRDPinSide::Top;    break;
			case BRDPartMountingSide::Bottom: pin.side = BRDPinSide::Bottom; break;
			case BRDPartMountingSide::Both:   pin.side = BRDPinSide::Both;   break;
		}
	}

	valid = current_block != 0;
}